

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
__thiscall
pybind11::move<std::__cxx11::string>
          (enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cast_error *this_00;
  handle local_f0;
  make_caster<std::__cxx11::basic_string<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (**(int **)this < 2) {
    detail::load_type<std::__cxx11::string>(&local_e8,(detail *)this,&obj->super_handle);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_e8.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.value._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.value.field_2._M_allocated_capacity._1_7_,
                    local_e8.value.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8.value.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e8.value._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.value.field_2._M_allocated_capacity._1_7_,
                    local_e8.value.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e8.value._M_string_length;
    local_e8.value._M_string_length = 0;
    local_e8.value.field_2._M_local_buf[0] = '\0';
    local_e8.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&local_e8);
    return __return_storage_ptr__;
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(*(undefined8 *)(*(long *)this + 8));
  str::operator_cast_to_string(&local_a0,(str *)&local_f0);
  std::operator+(&local_80,"Unable to move from Python ",&local_a0);
  std::operator+(&local_60,&local_80," instance to C++ ");
  type_id<std::__cxx11::string>();
  std::operator+(&local_40,&local_60,&local_c0);
  std::operator+(&local_e8.value,&local_40," instance: instance has multiple references");
  cast_error::runtime_error(this_00,&local_e8.value);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}